

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_jp_v2(opj_jp2_v2_t *jp2,uchar *p_header_data,uint p_header_size,
                       opj_event_mgr_t *p_manager)

{
  opj_event_mgr_t *in_RCX;
  int in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  uint l_magic_number;
  OPJ_UINT32 local_2c;
  opj_event_mgr_t *local_28;
  long local_10;
  opj_bool local_4;
  
  if (*(int *)(in_RDI + 100) == 0) {
    if (in_EDX == 4) {
      local_28 = in_RCX;
      local_10 = in_RDI;
      opj_read_bytes_LE(in_RSI,&local_2c,4);
      if (local_2c == 0xd0a870a) {
        *(uint *)(local_10 + 100) = *(uint *)(local_10 + 100) | 1;
        local_4 = 1;
      }
      else {
        opj_event_msg_v2(local_28,1,"Error with JP Signature : bad magic number\n");
        local_4 = 0;
      }
    }
    else {
      opj_event_msg_v2(in_RCX,1,"Error with JP signature Box size\n");
      local_4 = 0;
    }
  }
  else {
    opj_event_msg_v2(in_RCX,1,"The signature box must be the first box in the file.\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

opj_bool jp2_read_jp_v2(
					opj_jp2_v2_t *jp2,
					unsigned char * p_header_data,
					unsigned int p_header_size,
					opj_event_mgr_t * p_manager
				 )
{
	unsigned int l_magic_number;

	/* preconditions */
	assert(p_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	if (jp2->jp2_state != JP2_STATE_NONE) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "The signature box must be the first box in the file.\n");
		return OPJ_FALSE;
	}

	/* assure length of data is correct (4 -> magic number) */
	if (p_header_size != 4) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with JP signature Box size\n");
		return OPJ_FALSE;
	}

	/* rearrange data */
	opj_read_bytes(p_header_data,&l_magic_number,4);
	if (l_magic_number != 0x0d0a870a ) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with JP Signature : bad magic number\n");
		return OPJ_FALSE;
	}

	jp2->jp2_state |= JP2_STATE_SIGNATURE;

	return OPJ_TRUE;
}